

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_trng::count128_lcg_shift_&,_const_trng::count128_lcg_shift_&> * __thiscall
Catch::ExprLhs<trng::count128_lcg_shift_const&>::operator!=
          (ExprLhs<const_trng::count128_lcg_shift_&> *this,count128_lcg_shift *rhs)

{
  StringRef op;
  bool comparisonResult;
  count128_lcg_shift *in_RSI;
  BinaryExpr<const_trng::count128_lcg_shift_&,_const_trng::count128_lcg_shift_&> *in_RDI;
  count128_lcg_shift *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb8;
  char *pcVar1;
  BinaryExpr<const_trng::count128_lcg_shift_&,_const_trng::count128_lcg_shift_&> *pBVar2;
  
  pBVar2 = in_RDI;
  comparisonResult =
       compareNotEqual<trng::count128_lcg_shift,trng::count128_lcg_shift_const&>
                 (in_RSI,in_stack_ffffffffffffffa8);
  pcVar1 = *(char **)&(in_RSI->P).increment.value;
  StringRef::StringRef
            ((StringRef *)in_RDI,(char *)CONCAT17(comparisonResult,in_stack_ffffffffffffffb8));
  op.m_size = (size_type)pBVar2;
  op.m_start = pcVar1;
  BinaryExpr<const_trng::count128_lcg_shift_&,_const_trng::count128_lcg_shift_&>::BinaryExpr
            (in_RDI,comparisonResult,in_RSI,op,in_stack_ffffffffffffffa8);
  return pBVar2;
}

Assistant:

auto operator != ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareNotEqual( m_lhs, rhs ), m_lhs, "!=", rhs };
        }